

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::MaskProportionalityCase::iterate(MaskProportionalityCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  GLenum GVar3;
  Surface *surface;
  int precision;
  int precision_00;
  int precision_01;
  void *__buf;
  IterateResult IVar4;
  qpTestResult testResult;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  CaseType CVar13;
  int iVar14;
  GLfloat local_23c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  Vec2 local_1f8;
  Surface renderedImg;
  Vec4 local_1d8;
  Vec2 local_1c8;
  Vec2 local_1c0;
  Vec2 local_1b8;
  MessageBuilder local_1b0;
  
  pTVar2 = ((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  iVar12 = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface(&renderedImg,iVar12,iVar12);
  iVar12 = renderedImg.m_height * renderedImg.m_width;
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Clearing color to black");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  glwColorMask('\x01','\x01','\x01','\x01');
  GVar3 = glwGetError();
  glu::checkError(GVar3,"glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x473);
  glwClearColor(0.0,0.0,0.0,1.0);
  GVar3 = glwGetError();
  glu::checkError(GVar3,"glClearColor(0.0f, 0.0f, 0.0f, 1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x474);
  glwClear(0x4000);
  GVar3 = glwGetError();
  glu::checkError(GVar3,"glClear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x475);
  CVar13 = this->m_type;
  if (CVar13 == CASETYPE_ALPHA_TO_COVERAGE) {
    glwColorMask('\x01','\x01','\x01','\0');
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_FALSE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x479);
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Using color mask TRUE, TRUE, TRUE, FALSE");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    CVar13 = this->m_type;
  }
  local_1f8.m_data[0] = -1.0;
  local_1f8.m_data[1] = -1.0;
  local_1b8.m_data[0] = 1.0;
  local_1b8.m_data[1] = -1.0;
  local_1c0.m_data[0] = -1.0;
  local_1c0.m_data[1] = 1.0;
  local_1c8.m_data[0] = 1.0;
  local_1c8.m_data[1] = 1.0;
  local_1d8.m_data[0] = 1.0;
  local_1d8.m_data[1] = 0.0;
  local_1d8.m_data[2] = 0.0;
  local_1d8.m_data[3] = 1.0;
  local_23c = (float)this->m_currentIteration / (float)(this->m_numIterations + -1);
  if (CVar13 == CASETYPE_ALPHA_TO_COVERAGE) {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    de::floatToString_abi_cxx11_(&local_218,(de *)0x2,local_23c,precision_00);
    std::operator+(&local_238,"Drawing a red quad using alpha value ",&local_218);
    std::operator<<((ostream *)poVar1,(string *)&local_238);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    local_1d8.m_data[3] = local_23c;
  }
  else {
    if (CVar13 == CASETYPE_SAMPLE_COVERAGE_INVERTED) {
      local_23c = 1.0 - local_23c;
    }
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    de::floatToString_abi_cxx11_(&local_218,(de *)0x2,local_23c,precision);
    std::operator+(&local_238,"Drawing a red quad using sample coverage value ",&local_218);
    std::operator<<((ostream *)poVar1,(string *)&local_238);
    pcVar6 = "";
    if (CVar13 == CASETYPE_SAMPLE_COVERAGE_INVERTED) {
      pcVar6 = " (inverted)";
    }
    std::operator<<((ostream *)poVar1,pcVar6);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    glwSampleCoverage(local_23c,CVar13 == CASETYPE_SAMPLE_COVERAGE_INVERTED);
    GVar3 = glwGetError();
    glu::checkError(GVar3,"glSampleCoverage(coverageValue, isInverted ? GL_TRUE : GL_FALSE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x493);
  }
  MultisampleCase::renderQuad
            (&this->super_MultisampleCase,&local_1f8,&local_1b8,&local_1c0,&local_1c8,&local_1d8);
  MultisampleCase::readImage(&this->super_MultisampleCase,&renderedImg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"RenderedImage",(allocator<char> *)&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"Rendered image",(allocator<char> *)&local_1f8);
  surface = &renderedImg;
  testResult = QP_TEST_RESULT_FAIL;
  tcu::LogImage::LogImage
            ((LogImage *)&local_1b0,&local_238,&local_218,surface,QP_IMAGE_COMPRESSION_MODE_PNG);
  tcu::LogImage::write((LogImage *)&local_1b0,(int)pTVar2,__buf,(size_t)surface);
  tcu::LogImage::~LogImage((LogImage *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  iVar5 = 0;
  uVar8 = 0;
  if (0 < renderedImg.m_width) {
    uVar8 = (ulong)(uint)renderedImg.m_width;
  }
  if (renderedImg.m_height < 1) {
    renderedImg.m_height = 0;
  }
  iVar14 = 0;
  for (iVar9 = 0; uVar11 = uVar8, iVar10 = iVar5, iVar9 != renderedImg.m_height; iVar9 = iVar9 + 1)
  {
    while (uVar11 != 0) {
      iVar14 = iVar14 + (uint)*(byte *)((long)renderedImg.m_pixels.m_ptr + (long)iVar10 * 4);
      uVar11 = uVar11 - 1;
      iVar10 = iVar10 + 1;
    }
    iVar5 = iVar5 + renderedImg.m_width;
  }
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Average red color component: ");
  de::floatToString_abi_cxx11_
            (&local_238,(de *)0x2,((float)iVar14 / 255.0) / (float)iVar12,precision_01);
  std::operator<<((ostream *)poVar1,(string *)&local_238);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if (iVar14 < this->m_previousIterationColorSum) {
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
    std::operator<<((ostream *)&local_1b0.m_str,
                    "Failure: Current average red color component is lower than previous");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_003861f6:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
    pcVar6 = "Failed";
  }
  else {
    iVar5 = this->m_currentIteration;
    if ((iVar5 == 0) && (iVar14 != 0)) {
      local_1b0.m_log = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
      std::operator<<((ostream *)&local_1b0.m_str,"Failure: Image should be completely black");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_003861f6;
    }
    if ((iVar5 == this->m_numIterations + -1) && (iVar14 != iVar12 * 0xff)) {
      local_1b0.m_log = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
      std::operator<<((ostream *)&local_1b0.m_str,"Failure: Image should be completely red");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_003861f6;
    }
    this->m_previousIterationColorSum = iVar14;
    this->m_currentIteration = iVar5 + 1;
    if (iVar5 + 1 < this->m_numIterations) {
      IVar4 = CONTINUE;
      goto LAB_00386215;
    }
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Success: Number of coverage mask bits set appears to be, on average, proportional to "
                   );
    pcVar6 = "inverted sample coverage value";
    if (this->m_type == CASETYPE_SAMPLE_COVERAGE) {
      pcVar6 = "sample coverage value";
    }
    pcVar7 = "alpha";
    if (this->m_type != CASETYPE_ALPHA_TO_COVERAGE) {
      pcVar7 = pcVar6;
    }
    std::operator<<((ostream *)poVar1,pcVar7);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    pcVar6 = "Passed";
    testResult = QP_TEST_RESULT_PASS;
  }
  IVar4 = STOP;
  tcu::TestContext::setTestResult
            (((this->super_MultisampleCase).super_TestCase.m_context)->m_testCtx,testResult,pcVar6);
LAB_00386215:
  tcu::Surface::~Surface(&renderedImg);
  return IVar4;
}

Assistant:

MaskProportionalityCase::IterateResult MaskProportionalityCase::iterate (void)
{
	TestLog&		log				= m_testCtx.getLog();
	tcu::Surface	renderedImg		(m_viewportSize, m_viewportSize);
	deInt32			numPixels		= (deInt32)renderedImg.getWidth()*(deInt32)renderedImg.getHeight();

	log << TestLog::Message << "Clearing color to black" << TestLog::EndMessage;
	GLU_CHECK_CALL(glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE));
	GLU_CHECK_CALL(glClearColor(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));

	if (m_type == CASETYPE_ALPHA_TO_COVERAGE)
	{
		GLU_CHECK_CALL(glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_FALSE));
		log << TestLog::Message << "Using color mask TRUE, TRUE, TRUE, FALSE" << TestLog::EndMessage;
	}

	// Draw quad.

	{
		const Vec2		pt0						(-1.0f, -1.0f);
		const Vec2		pt1						( 1.0f, -1.0f);
		const Vec2		pt2						(-1.0f,  1.0f);
		const Vec2		pt3						( 1.0f,  1.0f);
		Vec4			quadColor				(1.0f, 0.0f, 0.0f, 1.0f);
		float			alphaOrCoverageValue	= (float)m_currentIteration / (float)(m_numIterations-1);

		if (m_type == CASETYPE_ALPHA_TO_COVERAGE)
		{
			log << TestLog::Message << "Drawing a red quad using alpha value " + de::floatToString(alphaOrCoverageValue, 2) << TestLog::EndMessage;
			quadColor.w() = alphaOrCoverageValue;
		}
		else
		{
			DE_ASSERT(m_type == CASETYPE_SAMPLE_COVERAGE || m_type == CASETYPE_SAMPLE_COVERAGE_INVERTED);

			bool	isInverted		= m_type == CASETYPE_SAMPLE_COVERAGE_INVERTED;
			float	coverageValue	= isInverted ? 1.0f - alphaOrCoverageValue : alphaOrCoverageValue;
			log << TestLog::Message << "Drawing a red quad using sample coverage value " + de::floatToString(coverageValue, 2) << (isInverted ? " (inverted)" : "") << TestLog::EndMessage;
			GLU_CHECK_CALL(glSampleCoverage(coverageValue, isInverted ? GL_TRUE : GL_FALSE));
		}

		renderQuad(pt0, pt1, pt2, pt3, quadColor);
	}

	// Read ang log image.

	readImage(renderedImg);

	log << TestLog::Image("RenderedImage", "Rendered image", renderedImg, QP_IMAGE_COMPRESSION_MODE_PNG);

	// Compute average red component in rendered image.

	deInt32 sumRed = 0;

	for (int y = 0; y < renderedImg.getHeight(); y++)
	for (int x = 0; x < renderedImg.getWidth(); x++)
		sumRed += renderedImg.getPixel(x, y).getRed();

	log << TestLog::Message << "Average red color component: " << de::floatToString((float)sumRed / 255.0f / (float)numPixels, 2) << TestLog::EndMessage;

	// Check if average color has decreased from previous frame's color.

	if (sumRed < m_previousIterationColorSum)
	{
		log << TestLog::Message << "Failure: Current average red color component is lower than previous" << TestLog::EndMessage;
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Failed");
		return STOP;
	}

	// Check if coverage mask is not all-zeros if alpha or coverage value is 0 (or 1, if inverted).

	if (m_currentIteration == 0 && sumRed != 0)
	{
		log << TestLog::Message << "Failure: Image should be completely black" << TestLog::EndMessage;
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Failed");
		return STOP;
	}

	if (m_currentIteration == m_numIterations-1 && sumRed != 0xff*numPixels)
	{
		log << TestLog::Message << "Failure: Image should be completely red" << TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Failed");
		return STOP;
	}

	m_previousIterationColorSum = sumRed;

	m_currentIteration++;

	if (m_currentIteration >= m_numIterations)
	{
		log << TestLog::Message
			<< "Success: Number of coverage mask bits set appears to be, on average, proportional to "
			<< (m_type == CASETYPE_ALPHA_TO_COVERAGE ? "alpha" : m_type == CASETYPE_SAMPLE_COVERAGE ? "sample coverage value" : "inverted sample coverage value")
			<< TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Passed");
		return STOP;
	}
	else
		return CONTINUE;
}